

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O2

uint64_t __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this,uint64_t node_id,uint64_t symb)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong i;
  ulong x;
  
  if (this->size_ == 0) {
    return 0xffffffffffffffff;
  }
  x = node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb;
  uVar1 = hash::vigna_hasher::hash(x);
  uVar2 = (this->capa_size_).mask_;
  do {
    i = uVar1 & uVar2;
    if (1 < i) {
      uVar1 = compact_vector::get(&this->table_,i);
      if (uVar1 == 0) {
        return 0xffffffffffffffff;
      }
      uVar1 = compact_vector::get(&this->table_,i);
      if (uVar1 == x) {
        return i;
      }
      uVar2 = (this->capa_size_).mask_;
    }
    uVar1 = i + 1;
  } while( true );
}

Assistant:

uint64_t find_child(uint64_t node_id, uint64_t symb) const {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        if (size_ == 0) {
            return nil_id;
        }

        uint64_t key = make_key_(node_id, symb);
        assert(key != 0);

        for (uint64_t i = Hasher::hash(key) & capa_size_.mask();; i = right_(i)) {
            if (i == 0) {
                // table_[0] is always empty so that table_[i] = 0 indicates to be empty.
                continue;
            }
            if (i == get_root()) {
                continue;
            }
            if (table_[i] == 0) {
                // encounter an empty slot
                return nil_id;
            }
            if (table_[i] == key) {
                return i;
            }
        }
    }